

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JacobiSVD.h
# Opt level: O2

JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> * __thiscall
Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::compute
          (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this,MatrixType *matrix,
          uint computationOptions)

{
  undefined1 *this_00;
  Index IVar1;
  MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *xpr;
  bool bVar2;
  Index i_1;
  long lVar3;
  long i;
  float *pfVar4;
  Index p;
  long lVar5;
  undefined1 *puVar6;
  DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_01;
  float fVar7;
  Scalar SVar8;
  float fVar9;
  RealScalar scale;
  DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *local_128;
  MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 *local_f8;
  JacobiRotation<float> j_right;
  Index pos;
  JacobiRotation<float> j_left;
  
  allocate(this,3,3,computationOptions);
  j_left = (JacobiRotation<float>)matrix;
  scale = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
          ::maxCoeff<1>((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                         *)&j_left);
  if ((uint)ABS(scale) < 0x7f800000) {
    if ((scale == 0.0) && (!NAN(scale))) {
      scale = 1.0;
    }
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows ==
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols) {
      IVar1 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize;
      Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false> *)&j_right,matrix,
                 0,0,IVar1,IVar1);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,-1,-1,false>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
                  *)&j_left,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,_1,_1,false>> *)
                 &j_right,&scale);
      internal::
      call_assignment<Eigen::Matrix<float,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,_1,_1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,3,3>const>const>>
                ((Matrix<float,_3,_3,_0,_3,_3> *)
                 &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  field_0x8c,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
                  *)&j_left);
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeFullU == true) {
        IVar1 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_rows;
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,IVar1,IVar1);
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeThinU == true) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_rows,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_diagSize);
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeFullV == true) {
        IVar1 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_cols;
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                   &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_matrixV,IVar1,IVar1);
      }
      if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_computeThinV == true) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                   &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_matrixV,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_cols,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_diagSize);
      }
    }
    else {
      MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                  *)&j_left,(MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)matrix,&scale);
      internal::
      call_assignment<Eigen::Matrix<float,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Matrix<float,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const>>
                (&this->m_scaledMatrix,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                  *)&j_left);
    }
    this_00 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               field_0x8c;
    j_right = (JacobiRotation<float>)this_00;
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
    ::diagonal((ConstDiagonalReturnType *)&j_left,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                *)&j_right);
    fVar7 = DenseBase<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
            ::maxCoeff<0>((DenseBase<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                           *)&j_left);
    local_120 = (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_matrixV;
    local_108 = &this->field_0x98;
    bVar2 = false;
    while (!bVar2) {
      bVar2 = true;
      local_110 = 0;
      local_118 = local_108;
      for (lVar5 = 1;
          lVar5 < (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_diagSize; lVar5 = lVar5 + 1) {
        local_f8 = this_00 + lVar5 * 4;
        local_100 = lVar5 * 0xc;
        pfVar4 = (float *)this_00;
        puVar6 = this_00;
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          fVar9 = fVar7 * 2.3841858e-07;
          if (fVar9 <= 1.1754944e-38) {
            fVar9 = 1.1754944e-38;
          }
          if ((fVar9 < ABS(*(float *)(puVar6 + local_110 + 4))) ||
             (fVar9 < ABS(*(float *)(local_118 + lVar3 * 4)))) {
            local_128 = (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(local_128._4_4_,fVar7);
            internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
                      ((Matrix<float,_3,_3,_0,_3,_3> *)this_00,lVar5,lVar3,&j_left,&j_right);
            MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheLeft<float>
                      ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this_00,lVar5,lVar3,
                       &j_left);
            if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeFullU != false) ||
               (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeThinU & 1U) != 0)) {
              pos = (ulong)j_left ^ 0x8000000000000000;
              MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                        ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,lVar5,lVar3,
                         (JacobiRotation<float> *)&pos);
            }
            MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                      ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this_00,lVar5,lVar3,
                       &j_right);
            if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeFullV != false) ||
               (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeThinV & 1U) != 0)) {
              MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                        (local_120,lVar5,lVar3,&j_right);
            }
            fVar7 = ABS(*pfVar4);
            if (ABS(*pfVar4) <= ABS(*(float *)(local_f8 + local_100))) {
              fVar7 = ABS(*(float *)(local_f8 + local_100));
            }
            if (fVar7 <= local_128._0_4_) {
              fVar7 = local_128._0_4_;
            }
            bVar2 = false;
          }
          pfVar4 = pfVar4 + 4;
          puVar6 = puVar6 + 0xc;
        }
        local_118 = local_118 + 0xc;
        local_110 = local_110 + 4;
      }
    }
    this_01 = (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
              &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_singularValues;
    lVar5 = 0x8c;
    for (lVar3 = 0;
        lVar3 < (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_diagSize; lVar3 = lVar3 + 1) {
      fVar7 = *(float *)((long)(this->
                               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                               ).m_matrixU.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data.array + lVar5);
      (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
      m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[lVar3] = ABS(fVar7);
      if ((fVar7 < 0.0) &&
         ((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_computeThinU |
           (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeFullU) & 1U) != 0)) {
        Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                  ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&j_right,
                   (Matrix<float,_3,_3,_0,_3,_3> *)this,lVar3);
        j_left = j_right;
        Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                  ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&pos,
                   (Matrix<float,_3,_3,_0,_3,_3> *)this,lVar3);
        internal::
        call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>const>>
                  ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&pos,
                   (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                    *)&j_left);
      }
      lVar5 = lVar5 + 0x10;
    }
    DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator*=(this_01,&scale);
    lVar5 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_diagSize;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_nonzeroSingularValues = lVar5;
    lVar3 = 0;
    local_128 = this_01;
    for (i = 0; i < lVar5; i = i + 1) {
      DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::tail<long>
                ((Type *)&j_left,this_01,lVar5 + lVar3);
      SVar8 = DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,-1,1,false>>::maxCoeff<0,long>
                        ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,_1,1,false>> *)
                         &j_left,&pos);
      if ((SVar8 == 0.0) && (!NAN(SVar8))) {
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_nonzeroSingularValues = i;
        break;
      }
      if (pos != 0) {
        pos = pos + i;
        fVar7 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[i];
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[i] =
             (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[pos];
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[pos] = fVar7;
        if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeFullU != false) ||
           (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeThinU & 1U) != 0)) {
          Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                    ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&j_left,
                     (Matrix<float,_3,_3,_0,_3,_3> *)this,pos);
          Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                    ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&j_right,
                     (Matrix<float,_3,_3,_0,_3,_3> *)this,i);
          DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>::
          swap<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>
                    ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>> *)&j_left,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &j_right);
        }
        xpr = local_120;
        if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeFullV != false) ||
           (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeThinV & 1U) != 0)) {
          Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                    ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&j_left,
                     (Matrix<float,_3,_3,_0,_3,_3> *)local_120,pos);
          Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                    ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *)&j_right,
                     (Matrix<float,_3,_3,_0,_3,_3> *)xpr,i);
          this_01 = local_128;
          DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>::
          swap<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>
                    ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>> *)&j_left,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &j_right);
        }
      }
      lVar5 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize;
      lVar3 = lVar3 + -1;
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
  }
  else {
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_info =
         InvalidInput;
  }
  return this;
}

Assistant:

JacobiSVD<MatrixType, QRPreconditioner>&
JacobiSVD<MatrixType, QRPreconditioner>::compute(const MatrixType& matrix, unsigned int computationOptions)
{
  using std::abs;
  allocate(matrix.rows(), matrix.cols(), computationOptions);

  // currently we stop when we reach precision 2*epsilon as the last bit of precision can require an unreasonable number of iterations,
  // only worsening the precision of U and V as we accumulate more rotations
  const RealScalar precision = RealScalar(2) * NumTraits<Scalar>::epsilon();

  // limit for denormal numbers to be considered zero in order to avoid infinite loops (see bug 286)
  const RealScalar considerAsZero = (std::numeric_limits<RealScalar>::min)();

  // Scaling factor to reduce over/under-flows
  RealScalar scale = matrix.cwiseAbs().template maxCoeff<PropagateNaN>();
  if (!(numext::isfinite)(scale)) {
    m_isInitialized = true;
    m_info = InvalidInput;
    return *this;
  }
  if(scale==RealScalar(0)) scale = RealScalar(1);
  
  /*** step 1. The R-SVD step: we use a QR decomposition to reduce to the case of a square matrix */

  if(m_rows!=m_cols)
  {
    m_scaledMatrix = matrix / scale;
    m_qr_precond_morecols.run(*this, m_scaledMatrix);
    m_qr_precond_morerows.run(*this, m_scaledMatrix);
  }
  else
  {
    m_workMatrix = matrix.block(0,0,m_diagSize,m_diagSize) / scale;
    if(m_computeFullU) m_matrixU.setIdentity(m_rows,m_rows);
    if(m_computeThinU) m_matrixU.setIdentity(m_rows,m_diagSize);
    if(m_computeFullV) m_matrixV.setIdentity(m_cols,m_cols);
    if(m_computeThinV) m_matrixV.setIdentity(m_cols, m_diagSize);
  }

  /*** step 2. The main Jacobi SVD iteration. ***/
  RealScalar maxDiagEntry = m_workMatrix.cwiseAbs().diagonal().maxCoeff();

  bool finished = false;
  while(!finished)
  {
    finished = true;

    // do a sweep: for all index pairs (p,q), perform SVD of the corresponding 2x2 sub-matrix

    for(Index p = 1; p < m_diagSize; ++p)
    {
      for(Index q = 0; q < p; ++q)
      {
        // if this 2x2 sub-matrix is not diagonal already...
        // notice that this comparison will evaluate to false if any NaN is involved, ensuring that NaN's don't
        // keep us iterating forever. Similarly, small denormal numbers are considered zero.
        RealScalar threshold = numext::maxi<RealScalar>(considerAsZero, precision * maxDiagEntry);
        if(abs(m_workMatrix.coeff(p,q))>threshold || abs(m_workMatrix.coeff(q,p)) > threshold)
        {
          finished = false;
          // perform SVD decomposition of 2x2 sub-matrix corresponding to indices p,q to make it diagonal
          // the complex to real operation returns true if the updated 2x2 block is not already diagonal
          if(internal::svd_precondition_2x2_block_to_be_real<MatrixType, QRPreconditioner>::run(m_workMatrix, *this, p, q, maxDiagEntry))
          {
            JacobiRotation<RealScalar> j_left, j_right;
            internal::real_2x2_jacobi_svd(m_workMatrix, p, q, &j_left, &j_right);

            // accumulate resulting Jacobi rotations
            m_workMatrix.applyOnTheLeft(p,q,j_left);
            if(computeU()) m_matrixU.applyOnTheRight(p,q,j_left.transpose());

            m_workMatrix.applyOnTheRight(p,q,j_right);
            if(computeV()) m_matrixV.applyOnTheRight(p,q,j_right);

            // keep track of the largest diagonal coefficient
            maxDiagEntry = numext::maxi<RealScalar>(maxDiagEntry,numext::maxi<RealScalar>(abs(m_workMatrix.coeff(p,p)), abs(m_workMatrix.coeff(q,q))));
          }
        }
      }
    }
  }

  /*** step 3. The work matrix is now diagonal, so ensure it's positive so its diagonal entries are the singular values ***/

  for(Index i = 0; i < m_diagSize; ++i)
  {
    // For a complex matrix, some diagonal coefficients might note have been
    // treated by svd_precondition_2x2_block_to_be_real, and the imaginary part
    // of some diagonal entry might not be null.
    if(NumTraits<Scalar>::IsComplex && abs(numext::imag(m_workMatrix.coeff(i,i)))>considerAsZero)
    {
      RealScalar a = abs(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU()) m_matrixU.col(i) *= m_workMatrix.coeff(i,i)/a;
    }
    else
    {
      // m_workMatrix.coeff(i,i) is already real, no difficulty:
      RealScalar a = numext::real(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU() && (a<RealScalar(0))) m_matrixU.col(i) = -m_matrixU.col(i);
    }
  }
  
  m_singularValues *= scale;

  /*** step 4. Sort singular values in descending order and compute the number of nonzero singular values ***/

  m_nonzeroSingularValues = m_diagSize;
  for(Index i = 0; i < m_diagSize; i++)
  {
    Index pos;
    RealScalar maxRemainingSingularValue = m_singularValues.tail(m_diagSize-i).maxCoeff(&pos);
    if(maxRemainingSingularValue == RealScalar(0))
    {
      m_nonzeroSingularValues = i;
      break;
    }
    if(pos)
    {
      pos += i;
      std::swap(m_singularValues.coeffRef(i), m_singularValues.coeffRef(pos));
      if(computeU()) m_matrixU.col(pos).swap(m_matrixU.col(i));
      if(computeV()) m_matrixV.col(pos).swap(m_matrixV.col(i));
    }
  }

  m_isInitialized = true;
  return *this;
}